

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O0

int * macro_arg_subst(Sym **nested_list,int *macro_str,Sym *args)

{
  int iVar1;
  Sym *pSVar2;
  int local_f4;
  anon_union_8_3_a16eda46_for_Sym_3 aStack_f0;
  int t2;
  TokenString str2;
  char *pcStack_b0;
  int l0;
  char *s_1;
  CString cstr;
  TokenString str;
  CValue cval;
  Sym *s;
  int *st;
  int spc;
  int t1;
  int t0;
  int t;
  Sym *args_local;
  int *macro_str_local;
  Sym **nested_list_local;
  
  _t0 = args;
  args_local = (Sym *)macro_str;
  macro_str_local = (int *)nested_list;
  tok_str_new((TokenString *)&cstr.size_allocated);
  st._4_4_ = 0;
  spc = 0;
  do {
    TOK_GET(&t1,(int **)&args_local,(CValue *)&str.alloc);
    if (t1 == 0) {
      tok_str_add((TokenString *)&cstr.size_allocated,0);
      return (int *)cstr._16_8_;
    }
    if (t1 == 0x23) {
      TOK_GET(&t1,(int **)&args_local,(CValue *)&str.alloc);
      if ((t1 == 0) || (pSVar2 = sym_find2(_t0,t1), pSVar2 == (Sym *)0x0)) {
        expect("macro parameter after \'#\'");
      }
      cstr_new((CString *)&s_1);
      cstr_ccat((CString *)&s_1,0x22);
      s = (Sym *)(pSVar2->field_3).d;
      st._0_4_ = 0;
      while (-1 < s->v) {
        TOK_GET(&t1,(int **)&s,(CValue *)&str.alloc);
        if (((t1 != 0xcb) && (t1 != 0xcc)) && (iVar1 = check_space(t1,(int *)&st), iVar1 == 0)) {
          for (pcStack_b0 = get_tok_str(t1,(CValue *)&str.alloc); *pcStack_b0 != '\0';
              pcStack_b0 = pcStack_b0 + 1) {
            if ((t1 == 0xbf) && (*pcStack_b0 != '\'')) {
              add_char((CString *)&s_1,(int)*pcStack_b0);
            }
            else {
              cstr_ccat((CString *)&s_1,(int)*pcStack_b0);
            }
          }
        }
      }
      s_1._0_4_ = (int)s_1 - (int)st;
      cstr_ccat((CString *)&s_1,0x22);
      cstr_ccat((CString *)&s_1,0);
      str._48_4_ = (int)s_1;
      tok_str_add2((TokenString *)&cstr.size_allocated,0xbf,(CValue *)&str.alloc);
      cstr_free((CString *)&s_1);
    }
    else if (t1 < 0x100) {
      tok_str_add2((TokenString *)&cstr.size_allocated,t1,(CValue *)&str.alloc);
    }
    else {
      pSVar2 = sym_find2(_t0,t1);
      if (pSVar2 == (Sym *)0x0) {
        tok_str_add((TokenString *)&cstr.size_allocated,t1);
      }
      else {
        str2._52_4_ = (int)str.str;
        s = (Sym *)(pSVar2->field_3).d;
        if ((args_local->v == 0xcd) || (st._4_4_ == 0xcd)) {
          if ((st._4_4_ == 0xcd) && (((spc == 0x2c && (gnu_ext != 0)) && ((pSVar2->type).t != 0))))
          {
            if (0 < s->v) {
              str.str._0_4_ = (int)str.str + -1;
              goto LAB_0012f0d0;
            }
            str.str._0_4_ = (int)str.str + -2;
          }
        }
        else {
LAB_0012f0d0:
          if ((pSVar2->field_5).next == (Sym *)0x0) {
            sym_push2(&(pSVar2->field_5).next,pSVar2->v,(pSVar2->type).t,0);
            tok_str_new((TokenString *)&stack0xffffffffffffff10);
            macro_subst((TokenString *)&stack0xffffffffffffff10,(Sym **)macro_str_local,&s->v);
            tok_str_add((TokenString *)&stack0xffffffffffffff10,0);
            ((pSVar2->field_5).next)->field_3 = aStack_f0;
          }
          s = (Sym *)(((pSVar2->field_5).next)->field_3).d;
        }
        while (TOK_GET(&local_f4,(int **)&s,(CValue *)&str.alloc), 0 < local_f4) {
          tok_str_add2((TokenString *)&cstr.size_allocated,local_f4,(CValue *)&str.alloc);
        }
        if ((int)str.str == str2._52_4_) {
          tok_str_add((TokenString *)&cstr.size_allocated,0xcb);
        }
      }
    }
    spc = st._4_4_;
    st._4_4_ = t1;
  } while( true );
}

Assistant:

static int* macro_arg_subst(Sym** nested_list, const int* macro_str, Sym* args) {
  int t, t0, t1, spc;
  const int* st;
  Sym* s;
  CValue cval;
  TokenString str;
  CString cstr;

  tok_str_new(&str);
  t0 = t1 = 0;
  while (1) {
    TOK_GET(&t, &macro_str, &cval);
    if (!t)
      break;
    if (t == '#') {
      /* stringize */
      TOK_GET(&t, &macro_str, &cval);
      if (!t)
        goto bad_stringy;
      s = sym_find2(args, t);
      if (s) {
        cstr_new(&cstr);
        cstr_ccat(&cstr, '\"');
        st = s->d;
        spc = 0;
        while (*st >= 0) {
          TOK_GET(&t, &st, &cval);
          if (t != TOK_PLCHLDR && t != TOK_NOSUBST && 0 == check_space(t, &spc)) {
            const char* s = get_tok_str(t, &cval);
            while (*s) {
              if (t == TOK_PPSTR && *s != '\'')
                add_char(&cstr, *s);
              else
                cstr_ccat(&cstr, *s);
              ++s;
            }
          }
        }
        cstr.size -= spc;
        cstr_ccat(&cstr, '\"');
        cstr_ccat(&cstr, '\0');
#ifdef PP_DEBUG
        printf("\nstringize: <%s>\n", (char*)cstr.data);
#endif
        /* add string */
        cval.str.size = cstr.size;
        cval.str.data = cstr.data;
        tok_str_add2(&str, TOK_PPSTR, &cval);
        cstr_free(&cstr);
      } else {
      bad_stringy:
        expect("macro parameter after '#'");
      }
    } else if (t >= TOK_IDENT) {
      s = sym_find2(args, t);
      if (s) {
        int l0 = str.len;
        st = s->d;
        /* if '##' is present before or after, no arg substitution */
        if (*macro_str == TOK_PPJOIN || t1 == TOK_PPJOIN) {
          /* special case for var arg macros : ## eats the ','
             if empty VA_ARGS variable. */
          if (t1 == TOK_PPJOIN && t0 == ',' && gnu_ext && s->type.t) {
            if (*st <= 0) {
              /* suppress ',' '##' */
              str.len -= 2;
            } else {
              /* suppress '##' and add variable */
              str.len--;
              goto add_var;
            }
          }
        } else {
        add_var:
          if (!s->next) {
            /* Expand arguments tokens and store them.  In most
               cases we could also re-expand each argument if
               used multiple times, but not if the argument
               contains the __COUNTER__ macro.  */
            TokenString str2;
            sym_push2(&s->next, s->v, s->type.t, 0);
            tok_str_new(&str2);
            macro_subst(&str2, nested_list, st);
            tok_str_add(&str2, 0);
            s->next->d = str2.str;
          }
          st = s->next->d;
        }
        for (;;) {
          int t2;
          TOK_GET(&t2, &st, &cval);
          if (t2 <= 0)
            break;
          tok_str_add2(&str, t2, &cval);
        }
        if (str.len == l0) /* expanded to empty string */
          tok_str_add(&str, TOK_PLCHLDR);
      } else {
        tok_str_add(&str, t);
      }
    } else {
      tok_str_add2(&str, t, &cval);
    }
    t0 = t1, t1 = t;
  }
  tok_str_add(&str, 0);
  return str.str;
}